

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifilt.cpp
# Opt level: O3

void __thiscall icu_63::UnicodeFilter::matches(UnicodeFilter *this)

{
  int32_t in_ECX;
  int32_t *in_RDX;
  Replaceable *in_RSI;
  UBool in_R8B;
  
  matches((UnicodeFilter *)&this[-1].super_UnicodeMatcher,in_RSI,in_RDX,in_ECX,in_R8B);
  return;
}

Assistant:

UMatchDegree UnicodeFilter::matches(const Replaceable& text,
                                    int32_t& offset,
                                    int32_t limit,
                                    UBool incremental) {
    UChar32 c;
    if (offset < limit &&
        contains(c = text.char32At(offset))) {
        offset += U16_LENGTH(c);
        return U_MATCH;
    }
    if (offset > limit &&
        contains(c = text.char32At(offset))) {
        // Backup offset by 1, unless the preceding character is a
        // surrogate pair -- then backup by 2 (keep offset pointing at
        // the lead surrogate).
        --offset;
        if (offset >= 0) {
            offset -= U16_LENGTH(text.char32At(offset)) - 1;
        }
        return U_MATCH;
    }
    if (incremental && offset == limit) {
        return U_PARTIAL_MATCH;
    }
    return U_MISMATCH;
}